

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamwriter.cpp
# Opt level: O0

void __thiscall QCborStreamWriter::append(QCborStreamWriter *this,QCborSimpleType st)

{
  undefined1 in_SIL;
  _func_CborError_CborEncoder_ptr_uchar *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  
  std::unique_ptr<QCborStreamWriterPrivate,_std::default_delete<QCborStreamWriterPrivate>_>::
  operator->((unique_ptr<QCborStreamWriterPrivate,_std::default_delete<QCborStreamWriterPrivate>_> *
             )0x8de5ae);
  QCborStreamWriterPrivate::executeAppend<unsigned_char>
            ((QCborStreamWriterPrivate *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffe8,'\0');
  return;
}

Assistant:

void QCborStreamWriter::append(QCborSimpleType st)
{
    d->executeAppend(cbor_encode_simple_value, uint8_t(st));
}